

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

bool __thiscall
ON_SerialNumberMap::IsValid(ON_SerialNumberMap *this,bool bBuildHashTable,ON_TextLog *textlog)

{
  uint uVar1;
  ON_SN_BLOCK *pOVar2;
  ulong uVar3;
  SN_ELEMENT **ppSVar4;
  bool bVar5;
  bool bVar6;
  ON__UINT32 OVar7;
  SN_ELEMENT ***pppSVar8;
  char *pcVar9;
  SN_ELEMENT *pSVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  ON__UINT64 aic;
  ON__UINT64 local_48;
  ON_TextLog *local_40;
  ulong local_38;
  
  local_48 = 0;
  bVar14 = this->m_active_id_count != 0;
  if (bVar14 && !bBuildHashTable) {
    bVar14 = this->m_bHashTableIsValid != '\0';
  }
  if (((bVar14) && (this->m_bHashTableIsValid == '\0')) &&
     ((Internal_HashTableBuild(this), this->m_bHashTableIsValid == '\0' ||
      ((this->m_hash_table_blocks == (SN_ELEMENT ***)0x0 || (this->m_hash_block_count == 0)))))) {
    if (textlog == (ON_TextLog *)0x0) goto LAB_004d638c;
    pcVar9 = "Unable to build hash table.\n";
  }
  else {
    if (bVar14) {
      pppSVar8 = this->m_hash_table_blocks;
      OVar7 = this->m_hash_block_count;
    }
    else {
      pppSVar8 = (SN_ELEMENT ***)0x0;
      OVar7 = 0;
    }
    bVar6 = ON_SN_BLOCK::IsValidBlock(this->m_sn_block0,textlog,pppSVar8,OVar7,&local_48);
    if (bVar6) {
      uVar12 = (ulong)this->m_sn_block0->m_count;
      uVar11 = (ulong)this->m_sn_block0->m_purged;
      if (this->m_snblk_list_count != 0) {
        uVar13 = 0;
        do {
          pOVar2 = this->m_snblk_list[uVar13];
          if (pOVar2->m_count == 0) {
            if (textlog != (ON_TextLog *)0x0) {
              pcVar9 = "m_snblk_list[%d] is empty\n";
LAB_004d6338:
              ON_TextLog::Print(textlog,pcVar9,uVar13);
            }
            goto LAB_004d638c;
          }
          if (pOVar2->m_sorted != 1) {
            if (textlog != (ON_TextLog *)0x0) {
              pcVar9 = "m_snblk_list[%d] is not sorted\n";
              goto LAB_004d6338;
            }
            goto LAB_004d638c;
          }
          if (bVar14) {
            pppSVar8 = this->m_hash_table_blocks;
            OVar7 = this->m_hash_block_count;
          }
          else {
            pppSVar8 = (SN_ELEMENT ***)0x0;
            OVar7 = 0;
          }
          bVar6 = ON_SN_BLOCK::IsValidBlock(pOVar2,textlog,pppSVar8,OVar7,&local_48);
          if (!bVar6) {
            if (textlog != (ON_TextLog *)0x0) {
              pcVar9 = "m_snblk_list[%d] is not valid\n";
              goto LAB_004d6338;
            }
            goto LAB_004d638c;
          }
          pOVar2 = this->m_snblk_list[uVar13];
          if ((uVar13 != 0) && (pOVar2->m_sn0 <= this->m_snblk_list[uVar13 - 1]->m_sn1)) {
            if (textlog == (ON_TextLog *)0x0) goto LAB_004d638c;
            uVar12 = uVar13 - 1;
            pcVar9 = "m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n";
            goto LAB_004d6385;
          }
          uVar12 = uVar12 + pOVar2->m_count;
          uVar11 = uVar11 + pOVar2->m_purged;
          uVar13 = uVar13 + 1;
        } while (uVar13 < this->m_snblk_list_count);
      }
      uVar13 = this->m_sn_count;
      if (uVar12 == uVar13) {
        uVar3 = this->m_sn_purged;
        if (uVar11 == uVar3) {
          uVar11 = this->m_active_id_count;
          if (uVar11 == local_48) {
            if (uVar11 + uVar3 <= uVar13) {
              bVar6 = true;
              if (!bVar14) {
                return true;
              }
              bVar15 = this->m_hash_block_count == 0;
              bVar14 = !bVar15;
              local_40 = textlog;
              if (bVar15) {
                uVar12 = 0;
              }
              else {
                uVar11 = 0;
                uVar12 = 0;
                do {
                  ppSVar4 = this->m_hash_table_blocks[uVar11];
                  uVar13 = 0;
                  bVar15 = false;
                  local_38 = uVar11;
                  do {
                    uVar3 = this->m_active_id_count;
                    pSVar10 = ppSVar4[uVar13];
                    bVar5 = uVar3 < uVar12 || pSVar10 == (SN_ELEMENT *)0x0;
                    if (uVar3 >= uVar12 && pSVar10 != (SN_ELEMENT *)0x0) {
                      do {
                        uVar1 = pSVar10->m_id_crc32;
                        if ((uVar11 != (ulong)uVar1 % (ulong)this->m_hash_block_count) ||
                           (uVar13 != uVar1 / 0xffa + (uVar1 / 0xff4024) * -0xffa)) {
                          if (local_40 != (ON_TextLog *)0x0) {
                            ON_TextLog::Print(local_40,"m_hash_table linked lists are corrupt.\n");
                          }
                          bVar6 = ON_IsNotValid();
                          uVar11 = local_38;
                          break;
                        }
                        uVar12 = uVar12 + 1;
                        pSVar10 = pSVar10->m_next;
                        bVar5 = uVar3 < uVar12 || pSVar10 == (SN_ELEMENT *)0x0;
                      } while (uVar12 <= uVar3 && pSVar10 != (SN_ELEMENT *)0x0);
                    }
                    if (!bVar5) break;
                    bVar15 = 0xff8 < uVar13;
                    uVar13 = uVar13 + 1;
                  } while (uVar13 != 0xffa);
                  if (!bVar15) break;
                  uVar11 = uVar11 + 1;
                  bVar14 = uVar11 < this->m_hash_block_count;
                } while (bVar14);
              }
              if (bVar14) {
                return bVar6;
              }
              if (uVar12 <= this->m_active_id_count) {
                return true;
              }
              if (local_40 == (ON_TextLog *)0x0) goto LAB_004d638c;
              pcVar9 = "m_hash_table[] linked lists have too many elements.\n";
              textlog = local_40;
              goto LAB_004d62d4;
            }
            if (textlog == (ON_TextLog *)0x0) goto LAB_004d638c;
            pcVar9 = "m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n";
            uVar12 = uVar13 - uVar3;
            uVar13 = uVar11;
          }
          else {
            if (textlog == (ON_TextLog *)0x0) goto LAB_004d638c;
            pcVar9 = "m_active_id_count=%d (should be %d) is not correct\n";
            uVar12 = local_48;
            uVar13 = uVar11;
          }
        }
        else {
          if (textlog == (ON_TextLog *)0x0) goto LAB_004d638c;
          pcVar9 = "m_sn_purged=%d (should be %d) is not correct\n";
          uVar12 = uVar11;
          uVar13 = uVar3;
        }
      }
      else {
        if (textlog == (ON_TextLog *)0x0) goto LAB_004d638c;
        pcVar9 = "m_sn_count=%d (should be %d) is not correct\n";
      }
LAB_004d6385:
      ON_TextLog::Print(textlog,pcVar9,uVar13,uVar12);
      goto LAB_004d638c;
    }
    if (textlog == (ON_TextLog *)0x0) goto LAB_004d638c;
    pcVar9 = "m_sn_block0 is not valid\n";
  }
LAB_004d62d4:
  ON_TextLog::Print(textlog,pcVar9);
LAB_004d638c:
  bVar14 = ON_IsNotValid();
  return bVar14;
}

Assistant:

bool ON_SerialNumberMap::IsValid(
   bool bBuildHashTable,
   ON_TextLog* textlog
   ) const
{
  ON__UINT64 i, c, pc, aic;

  aic = 0;

  const bool bTestHashTable = (m_active_id_count > 0 && (bBuildHashTable || m_bHashTableIsValid));
  if (bTestHashTable && false == m_bHashTableIsValid)
  {
    const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableBuild();
    if (false == m_bHashTableIsValid || nullptr == m_hash_table_blocks || m_hash_block_count <= 0)
    {
      if ( textlog )
        textlog->Print("Unable to build hash table.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( !m_sn_block0.IsValidBlock(
    textlog,
    bTestHashTable ? m_hash_table_blocks : nullptr,
    bTestHashTable ? m_hash_block_count : 0,
    &aic) 
    )
  {
    if ( textlog )
      textlog->Print("m_sn_block0 is not valid\n");
    return ON_SerialNumberMap_IsNotValid();
  }

  c = m_sn_block0.m_count;
  pc = m_sn_block0.m_purged;

  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is empty\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( 1 != m_snblk_list[i]->m_sorted )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not sorted\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( !m_snblk_list[i]->IsValidBlock(
      textlog,
      bTestHashTable ? m_hash_table_blocks : nullptr,
      bTestHashTable ? m_hash_block_count : 0,
      &aic) 
      )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not valid\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    c += m_snblk_list[i]->m_count;
    pc += m_snblk_list[i]->m_purged;
    if ( i>0 && m_snblk_list[i]->m_sn0 <= m_snblk_list[i-1]->m_sn1 )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n",i,i-1);
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( c != m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_sn_count=%d (should be %d) is not correct\n",m_sn_count,c);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( pc != m_sn_purged )
  {
    if ( textlog )
      textlog->Print("m_sn_purged=%d (should be %d) is not correct\n",m_sn_purged,pc);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count != aic )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d (should be %d) is not correct\n",m_active_id_count,aic);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count + m_sn_purged > m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n",m_active_id_count,m_sn_count-m_sn_purged);
    return ON_SerialNumberMap_IsNotValid();
  }

  if (bTestHashTable)
  {
    c = 0;
    for (ON__UINT32 hash_block_index = 0; hash_block_index < m_hash_block_count; hash_block_index++)
    {
      const SN_ELEMENT*const* hash_table_block = m_hash_table_blocks[hash_block_index];
      for (ON__UINT32 hash_i = 0; hash_i < ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY; hash_i++)
      {
        for (const SN_ELEMENT* e = hash_table_block[hash_i]; nullptr != e && c <= m_active_id_count; e = e->m_next)
        {
          if (
            hash_block_index != Internal_HashTableBlockIndex(e->m_id_crc32)
            || hash_i != ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32)
            )
          {
            if (textlog)
              textlog->Print("m_hash_table linked lists are corrupt.\n");
            return ON_SerialNumberMap_IsNotValid();
          }
          c++;
        }
      }
    }

    if (c > m_active_id_count)
    {
      if (textlog)
        textlog->Print("m_hash_table[] linked lists have too many elements.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  return true;
}